

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf-sequencing-algorithm.cpp
# Opt level: O2

set<int,_std::less<int>,_std::allocator<int>_> *
get_angles(set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,string *file,int n
          )

{
  _Rb_tree_header *p_Var1;
  ostream *poVar2;
  long lVar3;
  int local_2cc;
  char *local_2c8 [4];
  string line;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  q;
  ifstream _file;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&_file,(file->_M_dataplus)._M_p,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  if ((abStack_218[*(long *)(__file + -0x18)] & 5) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR: unable to open instance file: ");
    poVar2 = std::operator<<(poVar2,(string *)file);
    std::operator<<(poVar2,", stopping! \n");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"##Reading volume files.");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&_file,(string *)&line);
  std::ifstream::close();
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>(&q);
  lVar3 = std::__cxx11::string::find((char)&line,0x20);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&line);
  std::endl<char,std::char_traits<char>>(poVar2);
  while (lVar3 != -1) {
    std::__cxx11::string::substr((ulong)local_2c8,(ulong)&line);
    local_2cc = atoi(local_2c8[0]);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
    _M_insert_unique<int>(&__return_storage_ptr__->_M_t,&local_2cc);
    std::__cxx11::string::~string((string *)local_2c8);
    lVar3 = std::__cxx11::string::find((char)&line,0x20);
  }
  std::__cxx11::string::substr((ulong)local_2c8,(ulong)&line);
  local_2cc = atoi(local_2c8[0]);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(&__return_storage_ptr__->_M_t,&local_2cc);
  std::__cxx11::string::~string((string *)local_2c8);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque(&q.c);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&_file);
  return __return_storage_ptr__;
}

Assistant:

set<int> get_angles(string file, int n){
  ifstream _file(file.c_str(), ios::in);
  string line;

  if (! _file)
    cerr << "ERROR: unable to open instance file: " << file << ", stopping! \n";

  cout << "##Reading volume files." << endl;
  getline(_file, line);
  _file.close();

  set<int> angles;
  stack<string> q;
  char delim=' ';
  std::size_t current, previous = 0;
  current = line.find(delim);
  cout << line << endl;
  while (current != std::string::npos) {
    angles.insert(atoi(line.substr(previous, current - previous).c_str()));
    previous = current + 1;
    current = line.find(delim, previous);
  }
  angles.insert(atoi(line.substr(previous, current - previous).c_str()));

  return angles;
}